

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarQueueReorder(ImGuiTabBar *tab_bar,ImGuiTabItem *tab,int offset)

{
  if (offset == 0) {
    __assert_fail("offset != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1d27,"void ImGui::TabBarQueueReorder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                 );
  }
  if (tab_bar->ReorderRequestTabId == 0) {
    tab_bar->ReorderRequestTabId = tab->ID;
    tab_bar->ReorderRequestOffset = (ImS16)offset;
    return;
  }
  __assert_fail("tab_bar->ReorderRequestTabId == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_widgets.cpp"
                ,0x1d28,"void ImGui::TabBarQueueReorder(ImGuiTabBar *, const ImGuiTabItem *, int)");
}

Assistant:

void ImGui::TabBarQueueReorder(ImGuiTabBar* tab_bar, const ImGuiTabItem* tab, int offset)
{
    IM_ASSERT(offset != 0);
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    tab_bar->ReorderRequestTabId = tab->ID;
    tab_bar->ReorderRequestOffset = (ImS16)offset;
}